

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvamemtiming.c
# Opt level: O1

void signal_handler(int sig)

{
  size_t __size;
  char *__ptr;
  
  __size = 0x2f;
  if (sig == 0xb) {
    __size = 0x23;
  }
  __ptr = "Received a termination request. Exit nicely...\n";
  if (sig == 0xb) {
    __ptr = "Received a sigsegv. Exit nicely...\n";
  }
  fwrite(__ptr,__size,1,_stderr);
  system("killall X");
  exit(99);
}

Assistant:

void signal_handler(int sig)
{
	if (sig == SIGSEGV)
		fprintf(stderr, "Received a sigsegv. Exit nicely...\n");
	else
		fprintf(stderr, "Received a termination request. Exit nicely...\n");

	system("killall X");
	exit(99);
}